

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void operational_stats_test(bool multi_kv)

{
  size_t *psVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  fdb_status fVar5;
  int iVar6;
  uint8_t *puVar7;
  size_t sVar8;
  size_t sVar9;
  btree *pbVar10;
  fdb_config *fconfig_00;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  undefined7 in_register_00000039;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_ops_info *unaff_R12;
  code *unaff_R13;
  fdb_doc *pfVar15;
  char *info;
  ulong uVar16;
  btree *unaff_R15;
  bool bVar17;
  timeval tVar18;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_latency_stat stat;
  fdb_kvs_ops_info rinfo;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  fdb_doc real_doc;
  char bodybuf [256];
  fdb_config fconfig;
  int iStack_9b4;
  fdb_doc *pfStack_9b0;
  fdb_file_handle *pfStack_9a8;
  undefined4 uStack_9a0;
  undefined3 uStack_99c;
  undefined1 uStack_999;
  fdb_kvs_handle *pfStack_998;
  uint uStack_98c;
  timeval tStack_988;
  timeval tStack_978;
  timeval tStack_968;
  fdb_file_info fStack_958;
  char acStack_910 [1032];
  fdb_config *pfStack_508;
  fdb_kvs_ops_info *pfStack_500;
  fdb_doc *pfStack_4f8;
  btree *pbStack_4f0;
  btree *pbStack_4e8;
  fdb_config *pfStack_4e0;
  fdb_kvs_handle *local_4c8;
  fdb_doc *local_4c0;
  fdb_iterator *local_4b8;
  undefined8 uStack_4b0;
  fdb_kvs_handle *local_4a8 [4];
  undefined1 local_488 [64];
  undefined1 local_448 [32];
  undefined1 local_428 [56];
  undefined1 local_3f0 [40];
  btree local_3c8;
  char local_378 [256];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  fdb_doc local_228 [3];
  fdb_config local_128;
  
  pcVar13 = (char *)(CONCAT71(in_register_00000039,multi_kv) & 0xffffffff);
  info = (char *)0x0;
  pfStack_4e0 = (fdb_config *)0x112a5f;
  gettimeofday((timeval *)(local_3f0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_4e0 = (fdb_config *)0x112a64;
  memleak_start();
  local_4c0 = (fdb_doc *)local_278;
  local_488._0_16_ = (undefined1  [16])0x0;
  local_488._16_8_ = (void *)0x0;
  local_488._24_8_ = (kvs_info *)0x0;
  local_488._32_8_ = (fdb_config *)0x0;
  local_488._40_8_ = (fdb_file_handle *)0x0;
  local_488._48_8_ = (hbtrie *)0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258._8_8_ = 0;
  local_258._0_8_ = local_378;
  local_238._8_8_ = 0;
  local_238._0_8_ = local_228;
  pfStack_4e0 = (fdb_config *)0x112acb;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig_00 = &local_128;
  pfStack_4e0 = (fdb_config *)0x112adb;
  fdb_get_default_config();
  pfStack_4e0 = (fdb_config *)0x112ae8;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.seqtree_opt = '\x01';
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  local_128.multi_kv_instances = SUB81(pcVar13,0);
  pfStack_4e0 = (fdb_config *)0x112b1b;
  fdb_open((fdb_file_handle **)&local_4c8,"./dummy1",fconfig_00);
  uStack_4b0._4_4_ = (int)CONCAT71(in_register_00000039,multi_kv);
  if (uStack_4b0._4_4_ != 0) {
    fconfig_00 = (fdb_config *)0x3;
    info = (char *)0x18;
    unaff_R15 = (btree *)local_428;
    unaff_R12 = (fdb_kvs_ops_info *)local_3f0;
    unaff_R13 = logCallbackFunc;
    pcVar13 = "operational_stats_test";
    do {
      pfStack_4e0 = (fdb_config *)0x112b63;
      sprintf((char *)unaff_R15,"kv%d",(ulong)fconfig_00 & 0xffffffff);
      pfStack_4e0 = (fdb_config *)0x112b7b;
      fVar5 = fdb_kvs_open((fdb_file_handle *)local_4c8,
                           (fdb_kvs_handle **)((long)local_4a8 + (long)info),(char *)unaff_R15,
                           (fdb_kvs_config *)unaff_R12);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113110;
      pfStack_4e0 = (fdb_config *)0x112b93;
      fVar5 = fdb_set_log_callback
                        (local_4a8[(long)fconfig_00],logCallbackFunc,"operational_stats_test");
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011310b;
      info = (char *)&((btree *)((long)info + -0x38))->aux;
      bVar17 = fconfig_00 != (fdb_config *)0x0;
      fconfig_00 = (fdb_config *)&fconfig_00[-1].field_0xf7;
    } while (bVar17);
    local_488._56_8_ = (btree *)0x3;
LAB_00112bed:
    puVar7 = &((btree *)local_488._56_8_)->vsize;
    pcVar13 = local_428;
    fconfig_00 = (fdb_config *)local_488;
    info = (char *)0x0;
    do {
      pfStack_4e0 = (fdb_config *)0x112c29;
      sprintf(local_378,"key%d",(ulong)info & 0xffffffff);
      unaff_R13 = (code *)local_228;
      pfStack_4e0 = (fdb_config *)0x112c45;
      sprintf((char *)unaff_R13,"body%d",(ulong)info & 0xffffffff);
      unaff_R12 = (fdb_kvs_ops_info *)(&local_3c8.ksize + (long)info * 8);
      pfStack_4e0 = (fdb_config *)0x112c58;
      sVar8 = strlen(local_378);
      pfStack_4e0 = (fdb_config *)0x112c64;
      sVar9 = strlen((char *)unaff_R13);
      pfStack_4e0 = (fdb_config *)0x112c86;
      fdb_doc_create((fdb_doc **)unaff_R12,local_378,sVar8 + 1,(void *)0x0,0,unaff_R13,sVar9 + 1);
      info = (char *)((long)info + 1);
      unaff_R15 = (btree *)puVar7;
      do {
        pfStack_4e0 = (fdb_config *)0x112c9c;
        fVar5 = fdb_set((fdb_kvs_handle *)(&uStack_4b0)[(long)unaff_R15],
                        (fdb_doc *)unaff_R12->num_sets);
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_4e0 = (fdb_config *)0x11308a;
          operational_stats_test();
LAB_0011308a:
          pfStack_4e0 = (fdb_config *)0x11308f;
          operational_stats_test();
LAB_0011308f:
          pfStack_4e0 = (fdb_config *)0x1130a1;
          operational_stats_test();
          pfVar15 = (fdb_doc *)unaff_R13;
          goto LAB_001130a1;
        }
        pfStack_4e0 = (fdb_config *)0x112cb1;
        fVar5 = fdb_get_kvs_ops_info
                          ((fdb_kvs_handle *)(&uStack_4b0)[(long)unaff_R15],
                           (fdb_kvs_ops_info *)pcVar13);
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011308a;
        local_488._0_8_ = info;
        pfStack_4e0 = (fdb_config *)0x112cce;
        iVar6 = bcmp(pcVar13,fconfig_00,0x38);
        if (iVar6 != 0) goto LAB_0011308f;
        pbVar10 = (btree *)((long)&unaff_R15[-1].aux + 7);
        bVar17 = 0 < (long)unaff_R15;
        unaff_R15 = pbVar10;
      } while (pbVar10 != (btree *)0x0 && bVar17);
    } while (info != (char *)0xa);
    info = local_428;
    pbVar10 = (btree *)local_488._56_8_;
    do {
      pfStack_4e0 = (fdb_config *)0x112d1a;
      fdb_iterator_init(local_4a8[(long)pbVar10],&local_4b8,(void *)0x0,0,(void *)0x0,0,0);
      unaff_R15 = &local_3c8;
      pfVar15 = (fdb_doc *)unaff_R13;
      do {
        pfStack_4e0 = (fdb_config *)0x112d31;
        fVar5 = fdb_iterator_get(local_4b8,&local_4c0);
        unaff_R13 = (code *)local_4c0;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130a1;
        fconfig_00 = (fdb_config *)local_4c0->key;
        unaff_R12 = *(fdb_kvs_ops_info **)unaff_R15;
        pcVar13 = (char *)unaff_R12->num_gets;
        pfStack_4e0 = (fdb_config *)0x112d59;
        iVar6 = bcmp(fconfig_00,pcVar13,local_4c0->keylen);
        if (iVar6 != 0) goto LAB_001130ab;
        fconfig_00 = (fdb_config *)((fdb_doc *)unaff_R13)->body;
        pcVar13 = (char *)unaff_R12[1].num_dels;
        pfStack_4e0 = (fdb_config *)0x112d79;
        iVar6 = bcmp(fconfig_00,pcVar13,((fdb_doc *)unaff_R13)->bodylen);
        if (iVar6 != 0) goto LAB_001130c8;
        pfStack_4e0 = (fdb_config *)0x112d93;
        fVar5 = fdb_get_kvs_ops_info(local_4a8[(long)pbVar10],(fdb_kvs_ops_info *)info);
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130a6;
        local_488._40_8_ = (long)(fdb_kvs_handle **)local_488._40_8_ + 1;
        local_488._48_8_ = local_488._48_8_ + 1;
        pfStack_4e0 = (fdb_config *)0x112dc1;
        iVar6 = bcmp(info,local_488,0x38);
        if (iVar6 != 0) goto LAB_001130b6;
        pfStack_4e0 = (fdb_config *)0x112dd3;
        fVar5 = fdb_iterator_next(local_4b8);
        unaff_R15 = (btree *)&unaff_R15->root_bid;
        pfVar15 = (fdb_doc *)unaff_R13;
      } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
      local_488._48_8_ = local_488._48_8_ + 1;
      pfStack_4e0 = (fdb_config *)0x112df2;
      fdb_iterator_close(local_4b8);
      pfStack_4e0 = (fdb_config *)0x112e01;
      fdb_commit((fdb_file_handle *)local_4c8,'\x01');
      local_488._16_8_ = (void *)(local_488._16_8_ + 1);
      pfStack_4e0 = (fdb_config *)0x112e18;
      fVar5 = fdb_get_kvs_ops_info(local_4a8[(long)pbVar10],(fdb_kvs_ops_info *)info);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113101;
      pfStack_4e0 = (fdb_config *)0x112e32;
      iVar6 = bcmp(info,local_488,0x38);
      if (iVar6 != 0) goto LAB_001130ef;
      if (pbVar10 != (btree *)0x0) {
        local_488._40_8_ = (fdb_file_handle *)0x0;
        local_488._48_8_ = (hbtrie *)0x0;
      }
      bVar17 = 0 < (long)pbVar10;
      pbVar10 = (btree *)((long)&pbVar10[-1].aux + 7);
    } while (bVar17);
    local_488._24_8_ = local_488._24_8_ + 1;
    pfStack_4e0 = (fdb_config *)0x112e74;
    fdb_compact((fdb_file_handle *)local_4c8,"./dummy2");
    pfStack_4e0 = (fdb_config *)0x112e86;
    fVar5 = fdb_get_kvs_ops_info(local_4a8[0],(fdb_kvs_ops_info *)local_428);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113115;
    pfStack_4e0 = (fdb_config *)0x112ea5;
    iVar6 = bcmp(local_428,local_488,0x38);
    info = (char *)local_488._56_8_;
    if (iVar6 == 0) {
      unaff_R15 = (btree *)(local_488._56_8_ + 1);
      unaff_R12 = (fdb_kvs_ops_info *)local_428;
      unaff_R13 = (code *)local_488;
      fconfig_00 = (fdb_config *)0x0;
      do {
        pfStack_4e0 = (fdb_config *)0x112ee2;
        sprintf(local_378,"key%d",(ulong)fconfig_00 & 0xffffffff);
        pcVar13 = (char *)((long)&fconfig_00->chunksize + 1);
        info = (char *)unaff_R15;
        do {
          if (((ulong)fconfig_00 & 1) == 0) {
            if (((ulong)fconfig_00 & 2) == 0) {
              pfStack_4e0 = (fdb_config *)0x112f01;
              fVar5 = fdb_get_metaonly((fdb_kvs_handle *)(&uStack_4b0)[(long)info],local_4c0);
            }
            else {
              local_4c0->seqnum = (fdb_seqnum_t)pcVar13;
              pfStack_4e0 = (fdb_config *)0x112f27;
              fVar5 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_4b0)[(long)info],local_4c0);
            }
          }
          else {
            pfStack_4e0 = (fdb_config *)0x112f12;
            fVar5 = fdb_get((fdb_kvs_handle *)(&uStack_4b0)[(long)info],local_4c0);
          }
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d3;
          pfStack_4e0 = (fdb_config *)0x112f3c;
          fVar5 = fdb_get_kvs_ops_info((fdb_kvs_handle *)(&uStack_4b0)[(long)info],unaff_R12);
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d8;
          pfStack_4e0 = (fdb_config *)0x112f59;
          local_488._32_8_ = pcVar13;
          iVar6 = bcmp(unaff_R12,unaff_R13,0x38);
          if (iVar6 != 0) goto LAB_001130dd;
          pbVar10 = (btree *)((long)&((btree *)((long)info + -0x38))->aux + 7);
          bVar17 = 0 < (long)info;
          info = (char *)pbVar10;
        } while (pbVar10 != (btree *)0x0 && bVar17);
        fconfig_00 = (fdb_config *)pcVar13;
      } while ((fdb_config *)pcVar13 != (fdb_config *)0xa);
      fconfig_00 = (fdb_config *)local_448;
      unaff_R15 = (btree *)&stderr;
      info = "%d:\t%u\t%u\t%u\t%lu\n";
      pcVar13 = (char *)0x0;
      while( true ) {
        local_448._0_16_ = (undefined1  [16])0x0;
        local_448._16_8_ = (docio_handle *)0x0;
        pfStack_4e0 = (fdb_config *)0x112fb5;
        fVar5 = fdb_get_latency_stats
                          ((fdb_file_handle *)local_4c8,(fdb_latency_stat *)fconfig_00,
                           (fdb_latency_stat_type)pcVar13);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfStack_4e0 = (fdb_config *)0x112fea;
        fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",pcVar13);
        uVar12 = (int)pcVar13 + 1;
        pcVar13 = (char *)(ulong)uVar12;
        if (uVar12 == 0x13) {
          pfStack_4e0 = (fdb_config *)0x112ffb;
          fdb_close((fdb_file_handle *)local_4c8);
          lVar11 = 0;
          do {
            pfStack_4e0 = (fdb_config *)0x11300a;
            fdb_doc_free(*(fdb_doc **)(&local_3c8.ksize + lVar11 * 8));
            lVar11 = lVar11 + 1;
          } while (lVar11 != 10);
          pfStack_4e0 = (fdb_config *)0x113018;
          fdb_shutdown();
          pfStack_4e0 = (fdb_config *)0x11301d;
          memleak_end();
          pcVar13 = "single kv instance";
          if (uStack_4b0._4_1_ != '\0') {
            pcVar13 = "multiple kv instances";
          }
          pfStack_4e0 = (fdb_config *)0x11304d;
          sprintf((char *)local_228,"Operational stats test %s",pcVar13);
          pcVar13 = "%s PASSED\n";
          if (operational_stats_test(bool)::__test_pass != '\0') {
            pcVar13 = "%s FAILED\n";
          }
          pfStack_4e0 = (fdb_config *)0x113073;
          fprintf(_stderr,pcVar13,local_228);
          return;
        }
      }
      goto LAB_00113106;
    }
    goto LAB_0011311a;
  }
  pfStack_4e0 = (fdb_config *)0x112bc3;
  pfVar14 = local_4c8;
  fVar5 = fdb_kvs_open_default((fdb_file_handle *)local_4c8,local_4a8,(fdb_kvs_config *)local_3f0);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_4e0 = (fdb_config *)0x112be3;
    pfVar14 = local_4a8[0];
    fVar5 = fdb_set_log_callback(local_4a8[0],logCallbackFunc,"operational_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113131;
    local_488._56_8_ = (btree *)0x0;
    goto LAB_00112bed;
  }
  goto LAB_0011312c;
LAB_001130a1:
  unaff_R13 = (code *)pfVar15;
  pfStack_4e0 = (fdb_config *)0x1130a6;
  operational_stats_test();
LAB_001130a6:
  pfStack_4e0 = (fdb_config *)0x1130ab;
  operational_stats_test();
LAB_001130ab:
  pfStack_4e0 = (fdb_config *)0x1130b6;
  operational_stats_test();
LAB_001130b6:
  pfStack_4e0 = (fdb_config *)0x1130c8;
  operational_stats_test();
LAB_001130c8:
  pfStack_4e0 = (fdb_config *)0x1130d3;
  operational_stats_test();
LAB_001130d3:
  pfStack_4e0 = (fdb_config *)0x1130d8;
  operational_stats_test();
LAB_001130d8:
  pfStack_4e0 = (fdb_config *)0x1130dd;
  operational_stats_test();
LAB_001130dd:
  pfStack_4e0 = (fdb_config *)0x1130ef;
  operational_stats_test();
LAB_001130ef:
  pfStack_4e0 = (fdb_config *)0x113101;
  operational_stats_test();
LAB_00113101:
  pfStack_4e0 = (fdb_config *)0x113106;
  operational_stats_test();
LAB_00113106:
  pfStack_4e0 = (fdb_config *)0x11310b;
  operational_stats_test();
LAB_0011310b:
  pfStack_4e0 = (fdb_config *)0x113110;
  operational_stats_test();
LAB_00113110:
  pfStack_4e0 = (fdb_config *)0x113115;
  operational_stats_test();
LAB_00113115:
  pfStack_4e0 = (fdb_config *)0x11311a;
  operational_stats_test();
LAB_0011311a:
  pfVar14 = (fdb_kvs_handle *)local_488;
  pfStack_4e0 = (fdb_config *)0x11312c;
  operational_stats_test();
LAB_0011312c:
  pfStack_4e0 = (fdb_config *)0x113131;
  operational_stats_test();
LAB_00113131:
  pfStack_4e0 = (fdb_config *)_worker_thread;
  operational_stats_test();
  pfStack_508 = fconfig_00;
  pfStack_500 = unaff_R12;
  pfStack_4f8 = (fdb_doc *)unaff_R13;
  pbStack_4f0 = (btree *)info;
  pbStack_4e8 = unaff_R15;
  pfStack_4e0 = (fdb_config *)pcVar13;
  gettimeofday(&tStack_968,(__timezone_ptr_t)0x0);
  pfStack_9b0 = (fdb_doc *)0x0;
  sprintf(acStack_910,"dummy%d",(ulong)*(uint *)&pfVar14->file->filename);
  fdb_open(&pfStack_9a8,acStack_910,(fdb_config *)pfVar14->btreeblkops);
  fdb_kvs_open_default(pfStack_9a8,&pfStack_998,(fdb_kvs_config *)pfVar14->fileops);
  fVar5 = fdb_set_log_callback(pfStack_998,logCallbackFunc,"worker_thread");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x6c4);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x6c4,"void *_worker_thread(void *)");
  }
  pthread_spin_lock((pthread_spinlock_t *)pfVar14->dhandle);
  *(int *)(pfVar14->field_6).seqtree = *(int *)(pfVar14->field_6).seqtree + 1;
  pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
  while( true ) {
    pthread_spin_lock((pthread_spinlock_t *)pfVar14->dhandle);
    pbVar10 = (pfVar14->field_6).seqtree;
    iVar6._0_1_ = pbVar10->ksize;
    iVar6._1_1_ = pbVar10->vsize;
    iVar6._2_2_ = pbVar10->height;
    if ((list *)(pfVar14->kvs_config).custom_cmp == (list *)(long)iVar6) break;
    pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
    sleep(1);
  }
  pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
  gettimeofday((timeval *)&tStack_978,(__timezone_ptr_t)0x0);
  uStack_999 = 0;
  uVar16 = 0;
  iStack_9b4 = 0;
  do {
    iVar6 = rand();
    iVar6 = (int)((ulong)(long)iVar6 % (ulong)(pfVar14->kvs_config).custom_cmp_param);
    psVar1 = (size_t *)(&pfVar14->op_stats->num_sets)[iVar6].super___atomic_base<unsigned_long>._M_i
    ;
    fdb_doc_create(&pfStack_9b0,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
    fVar5 = fdb_get(pfStack_998,pfStack_9b0);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e1);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e1,"void *_worker_thread(void *)");
    }
    plVar2 = (long *)pfStack_9b0->body;
    plVar3 = *(long **)((&pfVar14->op_stats->num_sets)[iVar6].super___atomic_base<unsigned_long>.
                        _M_i + 0x40);
    if (*plVar2 != *plVar3) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",plVar3,plVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e2,"void *_worker_thread(void *)");
    }
    if (pfVar14->kvs != (kvs_info *)0x0) {
      uStack_9a0 = (undefined4)plVar2[1];
      uStack_99c = (undefined3)((uint)*(undefined4 *)((long)plVar2 + 0xb) >> 8);
      iVar6 = atoi((char *)&uStack_9a0);
      sprintf((char *)&uStack_9a0,"%0 7d",(ulong)(iVar6 + 1));
      pvVar4 = pfStack_9b0->body;
      *(uint *)((long)pvVar4 + 0xb) = CONCAT31(uStack_99c,uStack_9a0._3_1_);
      *(undefined4 *)((long)pvVar4 + 8) = uStack_9a0;
      fVar5 = fdb_set(pfStack_998,pfStack_9b0);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x6f0);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x6f0,"void *_worker_thread(void *)");
      }
      if ((pfVar14->trie != (hbtrie *)0x0) && (uVar16 % (ulong)pfVar14->trie == 0)) {
        fdb_commit(pfStack_9a8,'\0');
        iStack_9b4 = iStack_9b4 + 1;
        fdb_get_file_info(pfStack_9a8,&fStack_958);
        if ((pfVar14->staletree == (btree *)(long)iStack_9b4) &&
           (((pfVar14->staletree != (btree *)0x0 && (fStack_958.new_filename == (char *)0x0)) &&
            (*(int *)&pfVar14->kvs_config == 0)))) {
          pthread_spin_lock((pthread_spinlock_t *)pfVar14->dhandle);
          uStack_98c = *(int *)&pfVar14->file->filename + 1;
          *(uint *)&pfVar14->file->filename = uStack_98c;
          pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
          iStack_9b4 = 0;
          sprintf(acStack_910,"dummy%d",(ulong)uStack_98c);
          fVar5 = fdb_compact(pfStack_9a8,acStack_910);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pthread_spin_lock((pthread_spinlock_t *)pfVar14->dhandle);
            *(int *)&pfVar14->file->filename = *(int *)&pfVar14->file->filename + -1;
            pthread_spin_unlock((pthread_spinlock_t *)pfVar14->dhandle);
          }
        }
      }
    }
    fdb_doc_free(pfStack_9b0);
    pfStack_9b0 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
    gettimeofday((timeval *)&tStack_988,(__timezone_ptr_t)0x0);
    tVar18 = _utime_gap(tStack_978,tStack_988);
  } while ((fdb_file_handle *)tVar18.tv_sec < pfVar14->fhandle);
  pcVar13 = "writer";
  if (pfVar14->kvs == (kvs_info *)0x0) {
    pcVar13 = "reader";
  }
  printf("Thread #%d (%s) %d ops / %d seconds\n",(ulong)*(uint *)&pfVar14->kvs_config,pcVar13,
         uVar16 & 0xffffffff);
  pfVar14->bhandle = (btreeblk_handle *)(uVar16 & 0xffffffff);
  fdb_commit(pfStack_9a8,'\x01');
  fdb_kvs_close(pfStack_998);
  fdb_close(pfStack_9a8);
  pthread_exit((void *)0x0);
}

Assistant:

void operational_stats_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int num_kv = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, num_kv);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc real_doc;
    fdb_doc *rdoc = &real_doc;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_kvs_ops_info info, rinfo;

    char keybuf[256], bodybuf[256];
    memset(&info, 0, sizeof(fdb_kvs_ops_info));
    memset(&real_doc, 0, sizeof(fdb_doc));
    real_doc.key = &keybuf;
    real_doc.body = &bodybuf;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    r = 0;

    fdb_open(&dbfile, "./dummy1", &fconfig);
    if (multi_kv) {
        num_kv = 4;
        for (r = num_kv - 1; r >= 0; --r) {
            char tmp[16];
            sprintf(tmp, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], tmp, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                                          (void *) "operational_stats_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    } else {
        num_kv = 1;
        status = fdb_kvs_open_default(dbfile, &db[r], &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                (void *) "operational_stats_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (i = 0; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            info.num_sets = i + 1;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
        }
    }

    for (r = num_kv - 1; r >= 0; --r) {
        // range scan (before flushing WAL)
        fdb_iterator_init(db[r], &iterator, NULL, 0, NULL, 0, 0x0);
        i = 0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            ++info.num_iterator_gets;
            ++info.num_iterator_moves;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
            ++i;
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        ++info.num_iterator_moves; // account for the last move that failed
        fdb_iterator_close(iterator);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        ++info.num_commits;

        status = fdb_get_kvs_ops_info(db[r], &rinfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));

        if (r) {
            info.num_iterator_gets = 0;
            info.num_iterator_moves = 0;
        }
    }

    ++info.num_compacts;
    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    status = fdb_get_kvs_ops_info(db[0], &rinfo);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));

    for (i = 0; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        for (r = num_kv - 1; r >= 0; --r) {
            if (i % 2 == 0) {
                if (i % 4 == 0) {
                    status = fdb_get_metaonly(db[r], rdoc);
                } else {
                    rdoc->seqnum = i + 1;
                    status = fdb_get_byseq(db[r], rdoc);
                }
            } else {
                status = fdb_get(db[r], rdoc);
            }
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_ops_info(db[r], &rinfo);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            info.num_gets = i + 1;
            TEST_CMP(&rinfo, &info, sizeof(fdb_kvs_ops_info));
        }
    }
    // also get latency stats..
    for (int i = 0; i < FDB_LATENCY_NUM_STATS; ++i) {
        fdb_latency_stat stat;
        memset(&stat, 0, sizeof(fdb_latency_stat));
        status = fdb_get_latency_stats(dbfile, &stat, i);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fprintf(stderr, "%d:\t%u\t%u\t%u\t%" _F64 "\n", i,
                stat.lat_max, stat.lat_avg, stat.lat_max, stat.lat_count);
    }

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"Operational stats test %s", multi_kv ?
            "multiple kv instances" : "single kv instance");
    TEST_RESULT(bodybuf);
}